

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::matroska_read_header(MatroskaDemuxer *this)

{
  int *levelUp;
  Track *pTVar1;
  MatroskaTrack *track;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  ParsedLPCMTrackData *this_00;
  ostream *poVar5;
  undefined4 *puVar6;
  char *pcVar7;
  int i;
  long lVar8;
  int version;
  uint32_t local_204;
  char *doctype;
  _func_int **local_1f8;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  int last_level;
  ostringstream ss;
  
  for (lVar8 = 0; lVar8 < (this->super_IOContextDemuxer).num_tracks; lVar8 = lVar8 + 1) {
    pTVar1 = (this->super_IOContextDemuxer).tracks[lVar8];
    if (pTVar1 != (Track *)0x0) {
      operator_delete__(pTVar1);
    }
  }
  (this->super_IOContextDemuxer).num_tracks = 0;
  doctype = (char *)0x0;
  iVar2 = ebml_read_header(this,&doctype,&version);
  if (iVar2 < 0) {
    return iVar2;
  }
  if ((doctype == (char *)0x0) || (iVar2 = strcmp(doctype,"matroska"), iVar2 != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Wrong EBML doctype (\'");
    pcVar7 = "(none)";
    if (doctype != (char *)0x0) {
      pcVar7 = doctype;
    }
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::operator<<(poVar5,"\' != \'matroska\').");
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar6 = 900;
    *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
    if (local_1d0 == &local_1c0) {
      puVar6[6] = local_1c0;
      puVar6[7] = uStack_1bc;
      puVar6[8] = uStack_1b8;
      puVar6[9] = uStack_1b4;
    }
    else {
      *(uint **)(puVar6 + 2) = local_1d0;
      *(ulong *)(puVar6 + 6) = CONCAT44(uStack_1bc,local_1c0);
    }
    *(undefined8 *)(puVar6 + 4) = local_1c8;
    local_1c8 = 0;
    local_1c0 = local_1c0 & 0xffffff00;
    local_1d0 = &local_1c0;
    __cxa_throw(puVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (2 < version) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Matroska demuxer version 2 too old for file version ");
    std::ostream::operator<<(poVar5,version);
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar6 = 900;
    *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
    if (local_1f0 == &local_1e0) {
      puVar6[6] = local_1e0;
      puVar6[7] = uStack_1dc;
      puVar6[8] = uStack_1d8;
      puVar6[9] = uStack_1d4;
    }
    else {
      *(uint **)(puVar6 + 2) = local_1f0;
      *(ulong *)(puVar6 + 6) = CONCAT44(uStack_1dc,local_1e0);
    }
    *(undefined8 *)(puVar6 + 4) = local_1e8;
    local_1e8 = 0;
    local_1e0 = local_1e0 & 0xffffff00;
    local_1f0 = &local_1e0;
    __cxa_throw(puVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  while( true ) {
    uVar3 = ebml_peek_id(this,&last_level);
    if (uVar3 == 0) {
      return -1;
    }
    if (uVar3 == 0x18538067) break;
    iVar2 = ebml_read_skip(this);
    if (iVar2 < 0) {
      return iVar2;
    }
  }
  iVar2 = ebml_read_master(this,&local_204);
  if (iVar2 < 0) {
    return iVar2;
  }
  this->segment_start = (this->super_IOContextDemuxer).m_processedBytes;
  this->time_scale = 1000000;
  levelUp = &this->level_up;
  iVar2 = 0;
  do {
    if (iVar2 != 0) goto LAB_001acca0;
    uVar3 = ebml_peek_id(this,levelUp);
    if (uVar3 == 0) {
      iVar2 = -1;
      goto LAB_001acca0;
    }
    iVar4 = *levelUp;
    if (iVar4 != 0) {
      iVar2 = 0;
      break;
    }
    if ((uVar3 == 0xbf) || (uVar3 == 0xec)) goto LAB_001acc11;
    if (uVar3 == 0x1043a770) {
      iVar2 = ebml_read_master(this,&local_204);
      if (-1 < iVar2) {
        iVar2 = matroska_parse_chapters(this);
      }
LAB_001acc1c:
      iVar4 = *levelUp;
    }
    else {
      if (uVar3 == 0x114d9b74) {
        ebml_read_skip(this);
        iVar2 = 0;
        goto LAB_001acc1c;
      }
      if (uVar3 == 0x1254c367) {
        if (this->metadata_parsed != false) goto LAB_001acc11;
        iVar2 = ebml_read_master(this,&local_204);
        if (-1 < iVar2) {
          iVar2 = matroska_parse_metadata(this);
        }
        goto LAB_001acc1c;
      }
      if (uVar3 != 0x1f43b675) {
        if (uVar3 == 0x1654ae6b) {
          iVar2 = ebml_read_master(this,&local_204);
          if (-1 < iVar2) {
            iVar2 = matroska_parse_tracks(this);
          }
        }
        else if (uVar3 == 0x1c53bb6b) {
          if (this->index_parsed != false) goto LAB_001acc11;
          iVar2 = ebml_read_master(this,&local_204);
          if (-1 < iVar2) {
            iVar2 = matroska_parse_index(this);
          }
        }
        else if (uVar3 == 0x1549a966) {
          iVar2 = ebml_read_master(this,&local_204);
          if (-1 < iVar2) {
            iVar2 = matroska_parse_info(this);
          }
        }
        else {
LAB_001acc11:
          iVar2 = ebml_read_skip(this);
        }
        goto LAB_001acc1c;
      }
      iVar4 = 0;
      iVar2 = 1;
    }
  } while (iVar4 == 0);
  *levelUp = iVar4 + -1;
LAB_001acca0:
  uVar3 = ebml_peek_id(this,(int *)0x0);
  if (uVar3 == 0x1f43b675) {
    iVar2 = 0;
    local_1f8 = (_func_int **)&PTR__ParsedTrackPrivData_0024b178;
    for (lVar8 = 0; lVar8 < (this->super_IOContextDemuxer).num_tracks; lVar8 = lVar8 + 1) {
      track = (this->super_IOContextDemuxer).tracks[lVar8];
      track->stream_index = -1;
      pcVar7 = track->codec_id;
      if (pcVar7 != (char *)0x0) {
        iVar4 = this->num_streams;
        this->num_streams = iVar4 + 1;
        track->stream_index = iVar4;
        iVar4 = strcmp(pcVar7,"V_MPEG4/ISO/AVC");
        if ((iVar4 == 0) && (track->codec_priv != (uchar *)0x0)) {
          this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
          ParsedH264TrackData::ParsedH264TrackData
                    ((ParsedH264TrackData *)this_00,track->codec_priv,track->codec_priv_size);
        }
        else {
          iVar4 = strcmp(pcVar7,"V_MPEGH/ISO/HEVC");
          if ((iVar4 == 0) && (track->codec_priv != (uchar *)0x0)) {
            this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
            ParsedH265TrackData::ParsedH265TrackData
                      ((ParsedH265TrackData *)this_00,track->codec_priv,track->codec_priv_size);
          }
          else {
            iVar4 = strcmp(pcVar7,"V_MPEGI/ISO/VVC");
            if ((iVar4 == 0) && (track->codec_priv != (uchar *)0x0)) {
              this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
              ParsedH266TrackData::ParsedH266TrackData
                        ((ParsedH266TrackData *)this_00,track->codec_priv,track->codec_priv_size);
            }
            else {
              iVar4 = strcmp(pcVar7,"V_MS/VFW/FOURCC");
              if ((iVar4 == 0) && (track->codec_priv != (uchar *)0x0)) {
                this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
                ParsedVC1TrackData::ParsedVC1TrackData
                          ((ParsedVC1TrackData *)this_00,track->codec_priv,track->codec_priv_size);
              }
              else {
                iVar4 = strcmp(pcVar7,"A_AC3");
                if (iVar4 == 0) {
                  this_00 = (ParsedLPCMTrackData *)operator_new(0x10);
                  ParsedAC3TrackData::ParsedAC3TrackData
                            ((ParsedAC3TrackData *)this_00,track->codec_priv,track->codec_priv_size)
                  ;
                }
                else {
                  iVar4 = strcmp(pcVar7,"A_AAC");
                  if (iVar4 == 0) {
                    this_00 = (ParsedLPCMTrackData *)operator_new(0x28);
                    ParsedAACTrackData::ParsedAACTrackData
                              ((ParsedAACTrackData *)this_00,track->codec_priv,
                               track->codec_priv_size);
                  }
                  else {
                    iVar4 = strcmp(pcVar7,"A_PCM/INT/BIG");
                    if (((iVar4 == 0) || (iVar4 = strcmp(pcVar7,"A_PCM/INT/LIT"), iVar4 == 0)) ||
                       (iVar4 = strcmp(pcVar7,"A_MS/ACM"), iVar4 == 0)) {
                      this_00 = (ParsedLPCMTrackData *)operator_new(0x30);
                      ParsedLPCMTrackData::ParsedLPCMTrackData(this_00,track);
                    }
                    else {
                      iVar4 = strcmp(pcVar7,"S_TEXT/UTF8");
                      if (iVar4 == 0) {
                        this_00 = (ParsedLPCMTrackData *)operator_new(0x10);
                        ParsedSRTTrackData::ParsedSRTTrackData
                                  ((ParsedSRTTrackData *)this_00,track->codec_priv,
                                   track->codec_priv_size);
                      }
                      else {
                        iVar4 = strcmp(pcVar7,"S_HDMV/PGS");
                        if (iVar4 != 0) goto LAB_001acf08;
                        this_00 = (ParsedLPCMTrackData *)operator_new(8);
                        (this_00->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData = local_1f8;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        track->parsed_priv_data = &this_00->super_ParsedTrackPrivData;
      }
LAB_001acf08:
    }
  }
  return iVar2;
}

Assistant:

int MatroskaDemuxer::matroska_read_header()
{
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
    num_tracks = 0;

    // MatroskaDemuxContext *matroska = s->priv_data;
    char *doctype = nullptr;
    int version, last_level, res;
    uint32_t id;

    // matroska->ctx = s;

    /* First read the EBML header. */
    if ((res = ebml_read_header(&doctype, &version)) < 0)
        return res;
    if ((doctype == nullptr) || strcmp(doctype, "matroska") != 0)
    {
        THROW(ERR_MATROSKA_PARSE, "Wrong EBML doctype ('" << (doctype ? doctype : "(none)") << "' != 'matroska').")
    }
    if (version > 2)
    {
        THROW(ERR_MATROSKA_PARSE, "Matroska demuxer version 2 too old for file version " << version)
    }

    /* The next thing is a segment. */
    while (true)
    {
        if ((id = ebml_peek_id(&last_level)) == 0)
            return -BufferedReader::DATA_EOF;
        if (id == MATROSKA_ID_SEGMENT)
            break;
        if ((res = ebml_read_skip()) < 0)
            return res;
    }

    /* We now have a Matroska segment.
     * Seeks are from the beginning of the segment,
     * after the segment ID/length. */
    if ((res = ebml_read_master(&id)) < 0)
        return res;
    segment_start = m_processedBytes;

    time_scale = 1000000;
    /* we've found our segment, start reading the different contents in here */
    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* stream info */
        case MATROSKA_ID_INFO:
        {
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_info();
            break;
        }

        /* track info headers */
        case MATROSKA_ID_TRACKS:
        {
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_tracks();
            break;
        }

        case MATROSKA_ID_CHAPTERS:
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_chapters();
            break;

        /* stream index */
        case MATROSKA_ID_CUES:
        {
            if (!index_parsed)
            {
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                res = matroska_parse_index();
            }
            else
                res = ebml_read_skip();
            break;
        }

        /* metadata */
        case MATROSKA_ID_TAGS:
        {
            if (!metadata_parsed)
            {
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                res = matroska_parse_metadata();
            }
            else
                res = ebml_read_skip();
            break;
        }

        /* file index (if seekable, seek to Cues/Tags to parse it) */
        case MATROSKA_ID_SEEKHEAD:
        {
            ebml_read_skip();
            break;
        }

        case MATROSKA_ID_CLUSTER:
        {
            /* Do not read the master - this will be done in the next
             * call to matroska_read_packet. */
            res = 1;
            break;
        }

        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;

        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown matroska file header ID " << id);
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    /* Have we found a cluster? */
    if (ebml_peek_id(nullptr) == MATROSKA_ID_CLUSTER)
    {
        for (int i = 0; i < num_tracks; i++)
        {
            MatroskaTrack *track = tracks[i];
            track->stream_index = -1;
            if (track->codec_id == nullptr)
                continue;

            track->stream_index = num_streams++;

            if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH264TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_HEVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH265TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_VVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH266TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_VIDEO_VFW_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedVC1TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_AC3))
            {
                track->parsed_priv_data = new ParsedAC3TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_AAC))
            {
                track->parsed_priv_data = new ParsedAACTrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_PCM_BIG) ||
                     !strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_PCM_LIT) ||
                     !strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_ACM))
            {
                track->parsed_priv_data = new ParsedLPCMTrackData(track);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_SRT))
            {
                track->parsed_priv_data = new ParsedSRTTrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_SUBTITLE_PGS))
            {
                track->parsed_priv_data = new ParsedPGTrackData();
            }
        }
        res = 0;
    }

    return res;
}